

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldMessageAccessor::Swap
          (RepeatedPtrFieldMessageAccessor *this,Field *data,RepeatedFieldAccessor *other_mutator,
          Field *other_data)

{
  RepeatedPtrFieldMessageAccessor **v1;
  RepeatedFieldAccessor **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  RepeatedPtrField<google::protobuf::Message> *this_00;
  RepeatedPtrField<google::protobuf::Message> *other;
  LogMessage local_50;
  Voidify local_39;
  RepeatedPtrFieldMessageAccessor *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Field *other_data_local;
  RepeatedFieldAccessor *other_mutator_local;
  Field *data_local;
  RepeatedPtrFieldMessageAccessor *this_local;
  
  local_38 = this;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)other_data;
  other_data_local = other_mutator;
  other_mutator_local = (RepeatedFieldAccessor *)data;
  data_local = this;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::RepeatedPtrFieldMessageAccessor_const*>
                 (&local_38);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::RepeatedFieldAccessor_const*>
                 ((RepeatedFieldAccessor **)&other_data_local);
  local_30 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::internal::RepeatedPtrFieldMessageAccessor_const*,google::protobuf::internal::RepeatedFieldAccessor_const*>
                       (v1,v2,"this == other_mutator");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_internal.h"
               ,0x113,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  this_00 = (RepeatedPtrField<google::protobuf::Message> *)
            (**(code **)((long)*this + 0x88))(this,other_mutator_local);
  other = (RepeatedPtrField<google::protobuf::Message> *)
          (**(code **)((long)*this + 0x88))(this,absl_log_internal_check_op_result);
  RepeatedPtrField<google::protobuf::Message>::Swap(this_00,other);
  return;
}

Assistant:

void Swap(Field* data, const internal::RepeatedFieldAccessor* other_mutator,
            Field* other_data) const override {
    ABSL_CHECK_EQ(this, other_mutator);
    MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
  }